

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRExpression * __thiscall
spirv_cross::Compiler::
set<spirv_cross::SPIRExpression,std::__cxx11::string_const&,unsigned_int&,bool>
          (Compiler *this,uint32_t id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,uint *args_1,
          bool *args_2)

{
  SPIRExpression *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeExpression,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRExpression,std::__cxx11::string_const&,unsigned_int&,bool>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args,args_1,
                      args_2);
  (pSVar1->super_IVariant).self.id = id;
  pSVar1->emitted_loop_level = this->current_loop_level;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}